

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

cali_id_t cali_create_channel(char *name,int flags,cali_configset_t cfgset)

{
  bool allow;
  cali_id_t cVar1;
  Channel channel;
  RuntimeConfig cfg;
  Caliper c;
  
  cali::RuntimeConfig::RuntimeConfig(&cfg);
  cali::RuntimeConfig::allow_read_env(&cfg,allow);
  cali::RuntimeConfig::import(&cfg,&cfgset->cfgset);
  cali::Caliper::Caliper(&c);
  cali::Caliper::create_channel((Caliper *)&channel,(char *)&c,(RuntimeConfig *)name);
  cVar1 = 0xffffffffffffffff;
  if ((channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (0 < (channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count)) {
    if ((flags & 1U) == 0) {
      cali::Caliper::activate_channel(&c,&channel);
    }
    cVar1 = cali::Channel::id(&channel);
  }
  cali::Channel::~Channel(&channel);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cfg.mP.
              super___shared_ptr<cali::RuntimeConfig::RuntimeConfigImpl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return cVar1;
}

Assistant:

cali_id_t cali_create_channel(const char* name, int flags, cali_configset_t cfgset)
{
    RuntimeConfig cfg;

    cfg.allow_read_env(flags & CALI_CHANNEL_ALLOW_READ_ENV);
    cfg.import(cfgset->cfgset);

    Caliper c;
    Channel channel = c.create_channel(name, cfg);

    if (!channel)
        return CALI_INV_ID;
    if (!(flags & CALI_CHANNEL_LEAVE_INACTIVE))
        c.activate_channel(channel);

    return channel.id();
}